

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O2

ref<aphy::constraint_solver> __thiscall
aphy::
makeObjectWithInterface<aphy::constraint_solver,APhyBullet::BulletConstraintSolver,btSequentialImpulseConstraintSolver*>
          (aphy *this,btSequentialImpulseConstraintSolver *args)

{
  pointer __p;
  BulletConstraintSolver *this_00;
  undefined8 *puVar1;
  __uniq_ptr_impl<aphy::ref_counter<aphy::constraint_solver>,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
  local_20;
  
  this_00 = (BulletConstraintSolver *)::operator_new(0x18);
  APhyBullet::BulletConstraintSolver::BulletConstraintSolver
            (this_00,&args->super_btConstraintSolver);
  puVar1 = (undefined8 *)::operator_new(0x18);
  *puVar1 = cppRefcountedDispatchTable;
  puVar1[1] = this_00;
  puVar1[2] = 1;
  (this_00->super_constraint_solver).super_base_interface.myRefCounter = puVar1;
  local_20._M_t.
  super__Tuple_impl<0UL,_aphy::ref_counter<aphy::constraint_solver>_*,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
  .super__Head_base<0UL,_aphy::ref_counter<aphy::constraint_solver>_*,_false>._M_head_impl =
       (tuple<aphy::ref_counter<aphy::constraint_solver>_*,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
        )(_Tuple_impl<0UL,_aphy::ref_counter<aphy::constraint_solver>_*,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
          )0x0;
  *(undefined8 **)this = puVar1;
  std::
  unique_ptr<aphy::ref_counter<aphy::constraint_solver>,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
  ::~unique_ptr((unique_ptr<aphy::ref_counter<aphy::constraint_solver>,_std::default_delete<aphy::ref_counter<aphy::constraint_solver>_>_>
                 *)&local_20);
  return (ref<aphy::constraint_solver>)(Counter *)this;
}

Assistant:

inline ref<I> makeObjectWithInterface(Args... args)
{
    std::unique_ptr<T> object(new T(args...));
    std::unique_ptr<ref_counter<I>> counter(new ref_counter<I> (object.release()));
    return ref<I> (counter.release());
}